

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HBT_correlation.cpp
# Opt level: O3

void __thiscall HBT_correlation::output_HBTcorrelation(HBT_correlation *this)

{
  if (this->invariant_radius_flag_ == 1) {
    output_correlation_function_inv(this);
  }
  if (this->azimuthal_flag_ != 0) {
    output_correlation_function_Kphi_differential(this);
    return;
  }
  output_correlation_function(this);
  return;
}

Assistant:

void HBT_correlation::output_HBTcorrelation() {
    if (invariant_radius_flag_ == 1) output_correlation_function_inv();

    if (azimuthal_flag_ == 0) {
        output_correlation_function();
    } else {
        output_correlation_function_Kphi_differential();
    }
}